

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase887::run(TestCase887 *this)

{
  size_t sVar1;
  bool bVar2;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  Reader value_06;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Builder local_1d8;
  size_t size6;
  Builder sub;
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion;
  size_t size5;
  int local_154;
  size_t size4;
  size_t size2;
  size_t size;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size = AVar3.size_;
  if ((size != 2) && (kj::_::Debug::minSeverity < 3)) {
    oldVersion._builder.segment = (SegmentBuilder *)CONCAT44(oldVersion._builder.segment._4_4_,2);
    kj::_::Debug::log<char_const(&)[32],unsigned_int,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x381,ERROR,"\"failed: expected \" \"(2u) == (size)\", 2u, size",
               (char (*) [32])"failed: expected (2u) == (size)",(uint *)&oldVersion,&size);
  }
  sub._builder.segment = root._builder.segment;
  sub._builder.capTable = root._builder.capTable;
  sub._builder.data = root._builder.pointers;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            (&oldVersion,(Builder *)&sub);
  *(undefined8 *)oldVersion._builder.data = 0x7b;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&oldVersion,value);
  capnproto_test::capnp::test::TestOldVersion::Builder::initOld3(&sub,&oldVersion);
  *(undefined8 *)sub._builder.data = 0x1c8;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&sub,value_00);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size2 = AVar3.size_;
  if (((SegmentBuilder *)(size + 4) != (SegmentBuilder *)size2) && (kj::_::Debug::minSeverity < 3))
  {
    oldVersion._builder.segment = (SegmentBuilder *)(size + 4);
    kj::_::Debug::log<char_const(&)[39],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"(size + 4) == (size2)\", size + 4, size2",
               (char (*) [39])"failed: expected (size + 4) == (size2)",(unsigned_long *)&oldVersion,
               &size2);
  }
  sub._builder.segment = root._builder.segment;
  sub._builder.capTable = root._builder.capTable;
  sub._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)&oldVersion,(Builder *)&sub)
  ;
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size5 = AVar3.size_;
  if (((SegmentBuilder *)(size2 + 1) != (SegmentBuilder *)size5) && (kj::_::Debug::minSeverity < 3))
  {
    sub._builder.segment = (SegmentBuilder *)(size2 + 1);
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x397,ERROR,"\"failed: expected \" \"(size2 + 1) == (size3)\", size2 + 1, size3",
               (char (*) [40])"failed: expected (size2 + 1) == (size3)",(unsigned_long *)&sub,&size5
              );
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)&sub,(Builder *)&oldVersion);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size4 = AVar3.size_;
  if (size5 + 1 != size4 && kj::_::Debug::minSeverity < 3) {
    local_1d8._0_8_ = size5 + 1;
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x39d,ERROR,"\"failed: expected \" \"(size3 + 1) == (size4)\", size3 + 1, size4",
               (char (*) [40])"failed: expected (size3 + 1) == (size4)",(unsigned_long *)&local_1d8,
               &size4);
  }
  if ((*oldVersion._builder.data != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
    size6 = CONCAT44(size6._4_4_,0x7b);
    local_1d8._0_8_ = *oldVersion._builder.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a0,ERROR,
               "\"failed: expected \" \"(123) == (newVersion.getOld1())\", 123, newVersion.getOld1()"
               ,(char (*) [49])"failed: expected (123) == (newVersion.getOld1())",(int *)&size6,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&oldVersion);
  bVar2 = operator==("foo",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&oldVersion)
    ;
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a1,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", \"foo\", newVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
               (char (*) [4])"foo",&local_1d8);
  }
  if ((*(ulong *)((long)oldVersion._builder.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8._0_8_ = *(ulong *)((long)oldVersion._builder.data + 8) ^ 0x3db;
    size6 = CONCAT44(size6._4_4_,0x3db);
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a2,ERROR,
               "\"failed: expected \" \"(987) == (newVersion.getNew1())\", 987, newVersion.getNew1()"
               ,(char (*) [49])"failed: expected (987) == (newVersion.getNew1())",(int *)&size6,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&oldVersion);
  bVar2 = operator==("baz",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&oldVersion)
    ;
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a3,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (newVersion.getNew2())\", \"baz\", newVersion.getNew2()"
               ,(char (*) [51])"failed: expected (\"baz\") == (newVersion.getNew2())",
               (char (*) [4])0x2cc7a6,&local_1d8);
  }
  if ((*sub._builder.data != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    size6 = CONCAT44(size6._4_4_,0x1c8);
    local_1d8._0_8_ = *sub._builder.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a5,ERROR,"\"failed: expected \" \"(456) == (sub.getOld1())\", 456, sub.getOld1()"
               ,(char (*) [42])"failed: expected (456) == (sub.getOld1())",(int *)&size6,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&sub);
  bVar2 = operator==("bar",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&sub);
    kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a6,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (sub.getOld2())\", \"bar\", sub.getOld2()",
               (char (*) [44])"failed: expected (\"bar\") == (sub.getOld2())",(char (*) [4])0x2c587e
               ,&local_1d8);
  }
  if ((*(ulong *)((long)sub._builder.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8._0_8_ = *(ulong *)((long)sub._builder.data + 8) ^ 0x3db;
    size6 = CONCAT44(size6._4_4_,0x3db);
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a7,ERROR,"\"failed: expected \" \"(987) == (sub.getNew1())\", 987, sub.getNew1()"
               ,(char (*) [42])"failed: expected (987) == (sub.getNew1())",(int *)&size6,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&sub);
  bVar2 = operator==("baz",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&sub);
    kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a8,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (sub.getNew2())\", \"baz\", sub.getNew2()",
               (char (*) [44])"failed: expected (\"baz\") == (sub.getNew2())",(char (*) [4])0x2cc7a6
               ,&local_1d8);
  }
  *(undefined8 *)oldVersion._builder.data = 0xea;
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "qux";
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2((Builder *)&oldVersion,value_01);
  *(undefined8 *)((long)oldVersion._builder.data + 8) = 0x29a;
  value_02.super_StringPtr.content.size_ = 5;
  value_02.super_StringPtr.content.ptr = "quux";
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)&oldVersion,value_02);
  *(undefined8 *)sub._builder.data = 0x237;
  value_03.super_StringPtr.content.size_ = 6;
  value_03.super_StringPtr.content.ptr = "corge";
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2((Builder *)&sub,value_03);
  *(undefined8 *)((long)sub._builder.data + 8) = 0x155;
  value_04.super_StringPtr.content.size_ = 7;
  value_04.super_StringPtr.content.ptr = "grault";
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)&sub,value_04);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size5 = AVar3.size_;
  if (((SegmentBuilder *)(size4 + 6) != (SegmentBuilder *)size5) && (kj::_::Debug::minSeverity < 3))
  {
    oldVersion._builder.segment = (SegmentBuilder *)(size4 + 6);
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3b7,ERROR,"\"failed: expected \" \"(size4 + 6) == (size5)\", size4 + 6, size5",
               (char (*) [40])"failed: expected (size4 + 6) == (size5)",(unsigned_long *)&oldVersion
               ,&size5);
  }
  sub._builder.segment = root._builder.segment;
  sub._builder.capTable = root._builder.capTable;
  sub._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestOldVersion>
            (&oldVersion,(Builder *)&sub);
  if ((*oldVersion._builder.data != (SegmentBuilder *)0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8._0_4_ = 0xea;
    sub._builder.segment = *oldVersion._builder.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3bc,ERROR,
               "\"failed: expected \" \"(234) == (oldVersion.getOld1())\", 234, oldVersion.getOld1()"
               ,(char (*) [49])"failed: expected (234) == (oldVersion.getOld1())",(int *)&local_1d8,
               (long *)&sub);
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2((Builder *)&sub,&oldVersion);
  bVar2 = operator==("qux",(Builder *)&sub);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestOldVersion::Builder::getOld2((Builder *)&sub,&oldVersion);
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3bd,ERROR,
               "\"failed: expected \" \"(\\\"qux\\\") == (oldVersion.getOld2())\", \"qux\", oldVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"qux\") == (oldVersion.getOld2())",
               (char (*) [4])0x2d2176,(Builder *)&sub);
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld3(&sub,&oldVersion);
  if ((*sub._builder.data != 0x237) && (kj::_::Debug::minSeverity < 3)) {
    size6 = CONCAT44(size6._4_4_,0x237);
    local_1d8._0_8_ = *sub._builder.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3c0,ERROR,"\"failed: expected \" \"(567) == (sub.getOld1())\", 567, sub.getOld1()"
               ,(char (*) [42])"failed: expected (567) == (sub.getOld1())",(int *)&size6,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_1d8,&sub);
  bVar2 = operator==("corge",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_1d8,&sub);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3c1,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (sub.getOld2())\", \"corge\", sub.getOld2()"
               ,(char (*) [46])"failed: expected (\"corge\") == (sub.getOld2())",
               (char (*) [6])"corge",&local_1d8);
  }
  *(undefined8 *)oldVersion._builder.data = 0x159;
  value_05.super_StringPtr.content.size_ = 7;
  value_05.super_StringPtr.content.ptr = "garply";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&oldVersion,value_05);
  *(undefined8 *)sub._builder.data = 0x2a6;
  value_06.super_StringPtr.content.size_ = 6;
  value_06.super_StringPtr.content.ptr = "waldo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&sub,value_06);
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  size6 = AVar3.size_;
  if (((SegmentBuilder *)(size5 + 2) != (SegmentBuilder *)size6) && (kj::_::Debug::minSeverity < 3))
  {
    oldVersion._builder.segment = (SegmentBuilder *)(size5 + 2);
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3cc,ERROR,"\"failed: expected \" \"(size5 + 2) == (size6)\", size5 + 2, size6",
               (char (*) [40])"failed: expected (size5 + 2) == (size6)",(unsigned_long *)&oldVersion
               ,&size6);
  }
  sub._builder.segment = root._builder.segment;
  sub._builder.capTable = root._builder.capTable;
  sub._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)&oldVersion,(Builder *)&sub)
  ;
  if ((*oldVersion._builder.data != (SegmentBuilder *)0x159) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8._0_4_ = 0x159;
    sub._builder.segment = *oldVersion._builder.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d1,ERROR,
               "\"failed: expected \" \"(345) == (newVersion.getOld1())\", 345, newVersion.getOld1()"
               ,(char (*) [49])"failed: expected (345) == (newVersion.getOld1())",(int *)&local_1d8,
               (long *)&sub);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)&sub,(Builder *)&oldVersion);
  bVar2 = operator==("garply",(Builder *)&sub);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
              ((Builder *)&sub,(Builder *)&oldVersion);
    kj::_::Debug::log<char_const(&)[54],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d2,ERROR,
               "\"failed: expected \" \"(\\\"garply\\\") == (newVersion.getOld2())\", \"garply\", newVersion.getOld2()"
               ,(char (*) [54])"failed: expected (\"garply\") == (newVersion.getOld2())",
               (char (*) [7])"garply",(Builder *)&sub);
  }
  if ((*(ulong *)((long)oldVersion._builder.data + 8) != 0x29a) && (kj::_::Debug::minSeverity < 3))
  {
    sub._builder.segment =
         (SegmentBuilder *)(*(ulong *)((long)oldVersion._builder.data + 8) ^ 0x3db);
    local_1d8._0_4_ = 0x141;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d3,ERROR,
               "\"failed: expected \" \"(321) == (newVersion.getNew1())\", 321, newVersion.getNew1()"
               ,(char (*) [49])"failed: expected (321) == (newVersion.getNew1())",(int *)&local_1d8,
               (long *)&sub);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)&sub,(Builder *)&oldVersion);
  bVar2 = operator==("quux",(Builder *)&sub);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
              ((Builder *)&sub,(Builder *)&oldVersion);
    kj::_::Debug::log<char_const(&)[52],char_const(&)[5],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d4,ERROR,
               "\"failed: expected \" \"(\\\"quux\\\") == (newVersion.getNew2())\", \"quux\", newVersion.getNew2()"
               ,(char (*) [52])"failed: expected (\"quux\") == (newVersion.getNew2())",
               (char (*) [5])0x2d217d,(Builder *)&sub);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)&sub,(Builder *)&oldVersion);
  if ((*sub._builder.data != 0x2a6) && (kj::_::Debug::minSeverity < 3)) {
    local_154 = 0x2a6;
    local_1d8._0_8_ = *sub._builder.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d7,ERROR,"\"failed: expected \" \"(678) == (sub.getOld1())\", 678, sub.getOld1()"
               ,(char (*) [42])"failed: expected (678) == (sub.getOld1())",&local_154,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&sub);
  bVar2 = operator==("waldo",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2(&local_1d8,(Builder *)&sub);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d8,ERROR,
               "\"failed: expected \" \"(\\\"waldo\\\") == (sub.getOld2())\", \"waldo\", sub.getOld2()"
               ,(char (*) [46])"failed: expected (\"waldo\") == (sub.getOld2())",
               (char (*) [6])"waldo",&local_1d8);
  }
  if ((*(ulong *)((long)sub._builder.data + 8) != 0x155) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8._0_8_ = *(ulong *)((long)sub._builder.data + 8) ^ 0x3db;
    local_154 = 0x28e;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d9,ERROR,"\"failed: expected \" \"(654) == (sub.getNew1())\", 654, sub.getNew1()"
               ,(char (*) [42])"failed: expected (654) == (sub.getNew1())",&local_154,
               (long *)&local_1d8);
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&sub);
  bVar2 = operator==("grault",&local_1d8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_1d8,(Builder *)&sub);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3da,ERROR,
               "\"failed: expected \" \"(\\\"grault\\\") == (sub.getNew2())\", \"grault\", sub.getNew2()"
               ,(char (*) [47])"failed: expected (\"grault\") == (sub.getNew2())",
               (char (*) [7])"grault",&local_1d8);
  }
  sVar1 = size6;
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((sVar1 != AVar3.size_) && (kj::_::Debug::minSeverity < 3)) {
    AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    oldVersion._builder.segment = (SegmentBuilder *)AVar3.size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_long&,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3df,ERROR,
               "\"failed: expected \" \"(size6) == (builder.getSegmentsForOutput().size())\", size6, builder.getSegmentsForOutput().size()"
               ,(char (*) [68])"failed: expected (size6) == (builder.getSegmentsForOutput().size())"
               ,&size6,(unsigned_long *)&oldVersion);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderMultiSegment) {
  // Exactly like the previous test, except that we force multiple segments.  Since we force a
  // separate segment for every object, every pointer is a far pointer, and far pointers are easily
  // transferred, so this is actually not such a complicated case.

  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  // Start with a 1-word first segment and the root object in the second segment.
  size_t size = builder.getSegmentsForOutput().size();
  EXPECT_EQ(2u, size);

  {
    auto oldVersion = root.getAnyPointerField().initAs<test::TestOldVersion>();
    oldVersion.setOld1(123);
    oldVersion.setOld2("foo");
    auto sub = oldVersion.initOld3();
    sub.setOld1(456);
    sub.setOld2("bar");
  }

  // Allocated two structs and two strings.
  size_t size2 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size + 4, size2);

  size_t size4;

  {
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();

    // Allocated a new struct.
    size_t size3 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size2 + 1, size3);

    auto sub = newVersion.getOld3();

    // Allocated another new struct for its string field.
    size4 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size3 + 1, size4);

    // Check contents.
    EXPECT_EQ(123, newVersion.getOld1());
    EXPECT_EQ("foo", newVersion.getOld2());
    EXPECT_EQ(987, newVersion.getNew1());
    EXPECT_EQ("baz", newVersion.getNew2());

    EXPECT_EQ(456, sub.getOld1());
    EXPECT_EQ("bar", sub.getOld2());
    EXPECT_EQ(987, sub.getNew1());
    EXPECT_EQ("baz", sub.getNew2());

    newVersion.setOld1(234);
    newVersion.setOld2("qux");
    newVersion.setNew1(321);
    newVersion.setNew2("quux");

    sub.setOld1(567);
    sub.setOld2("corge");
    sub.setNew1(654);
    sub.setNew2("grault");
  }

  // Set four strings and implicitly initialized two.
  size_t size5 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size4 + 6, size5);

  {
    // Go back to old version.  It should have the values set on the new version.
    auto oldVersion = root.getAnyPointerField().getAs<test::TestOldVersion>();
    EXPECT_EQ(234, oldVersion.getOld1());
    EXPECT_EQ("qux", oldVersion.getOld2());

    auto sub = oldVersion.getOld3();
    EXPECT_EQ(567, sub.getOld1());
    EXPECT_EQ("corge", sub.getOld2());

    // Overwrite the old fields.  The new fields should remain intact.
    oldVersion.setOld1(345);
    oldVersion.setOld2("garply");
    sub.setOld1(678);
    sub.setOld2("waldo");
  }

  // Set two new strings.
  size_t size6 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size5 + 2, size6);

  {
    // Back to the new version again.
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();
    EXPECT_EQ(345, newVersion.getOld1());
    EXPECT_EQ("garply", newVersion.getOld2());
    EXPECT_EQ(321, newVersion.getNew1());
    EXPECT_EQ("quux", newVersion.getNew2());

    auto sub = newVersion.getOld3();
    EXPECT_EQ(678, sub.getOld1());
    EXPECT_EQ("waldo", sub.getOld2());
    EXPECT_EQ(654, sub.getNew1());
    EXPECT_EQ("grault", sub.getNew2());
  }

  // Size should not have changed because we didn't write anything and the structs were already
  // the right size.
  EXPECT_EQ(size6, builder.getSegmentsForOutput().size());
}